

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_g_Module.cpp
# Opt level: O0

void __thiscall axl::g::Module::~Module(Module *this)

{
  bool bVar1;
  FinalizerEntry *pFVar2;
  long in_RDI;
  FinalizerEntry *finalizerEntry;
  ListBase<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>_>
  *in_stack_ffffffffffffffd0;
  
  while (bVar1 = sl::
                 ListBase<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>_>
                 ::isEmpty((ListBase<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>_>
                            *)(in_RDI + 0x40)), ((bVar1 ^ 0xffU) & 1) != 0) {
    pFVar2 = sl::
             ListBase<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>_>
             ::removeTail(in_stack_ffffffffffffffd0);
    in_stack_ffffffffffffffd0 =
         (ListBase<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>_>
          *)rc::Ptr<axl::g::Finalizer>::operator->(&pFVar2->m_finalizer);
    (*(code *)(((in_stack_ffffffffffffffd0->super_ListData<axl::g::Module::FinalizerEntry>).m_head)
              ->super_ListLink).m_next)();
    if (pFVar2 != (FinalizerEntry *)0x0) {
      FinalizerEntry::~FinalizerEntry((FinalizerEntry *)0x130cce);
      operator_delete(pFVar2);
    }
  }
  sl::
  List<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::mem::Delete<axl::g::Module::FinalizerEntry>_>
  ::~List((List<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::mem::Delete<axl::g::Module::FinalizerEntry>_>
           *)0x130cea);
  sys::Lock::~Lock((Lock *)0x130cf8);
  return;
}

Assistant:

Module::~Module() {
	while (!m_finalizerList.isEmpty()) {
		FinalizerEntry* finalizerEntry = m_finalizerList.removeTail();
		finalizerEntry->m_finalizer->finalize();
		delete finalizerEntry;
	}
}